

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmprofiletocsv.cpp
# Opt level: O0

void fmprofiletocsv::dostep(bool skipheader)

{
  undefined8 in_R8;
  undefined8 in_R9;
  size_t local_60;
  size_t i;
  uint local_4d;
  fm_profile_step q;
  bool skipheader_local;
  
  q.scale1._0_1_ = skipheader;
  if (!skipheader) {
    printf("profile_id,calcrule_id,deductible1,deductible2,");
    printf("deductible3,attachment1,limit1,share1,share2,");
    printf("share3,step_id,calcrule_id,trigger_start,trigger_end,");
    printf("payout_start,payout_end,limit2,scale1,");
    printf("scale2\n");
  }
  fm_profile_step::fm_profile_step((fm_profile_step *)((long)&i + 7));
  local_60 = fread((void *)((long)&i + 7),0x48,1,_stdin);
  while (local_60 != 0) {
    printf("%d,%d,%f,%f,%f,%f,%f,%f,%f,%f,%d,%f,%f,%f,%f,%f,%f,%f\n",(double)(float)q.profile_id,
           (double)(float)q.calcrule_id,(double)q.deductible1,(double)q.deductible2,
           (double)q.deductible3,(double)q.attachment,(double)q.limit1,(double)q.share1,
           (ulong)stack0xffffffffffffffaf,(ulong)local_4d,(ulong)(uint)q.share2,in_R8,in_R9,
           (double)q.share3,(double)(float)q.step_id,(double)q.trigger_start,(double)q.trigger_end,
           (double)q.payout_start,(double)q.payout_end,(double)q.limit2);
    local_60 = fread((void *)((long)&i + 7),0x48,1,_stdin);
  }
  return;
}

Assistant:

void dostep(bool skipheader) {
		if (skipheader == false) {
            printf("profile_id,calcrule_id,deductible1,deductible2,");
            printf("deductible3,attachment1,limit1,share1,share2,");
            printf("share3,step_id,calcrule_id,trigger_start,trigger_end,");
			printf("payout_start,payout_end,limit2,scale1,");
			printf("scale2\n");
		}

		fm_profile_step q;
		size_t i = fread(&q, sizeof(q), 1, stdin);
		while (i != 0) {
			printf("%d,%d,%f,%f,%f,%f,%f,%f,%f,%f,%d,%f,%f,%f,%f,%f,%f,%f\n", q.profile_id,
                q.calcrule_id, q.deductible1, q.deductible2, q.deductible3,
                q.attachment, q.limit1, q.share1, q.share2, q.share3,q.step_id,
				q.trigger_start, q.trigger_end, q.payout_start,
				q.payout_end, q.limit2, q.scale1, q.scale2);

			i = fread(&q, sizeof(q), 1, stdin);
		}
	}